

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::Matchers::Impl::StdString::StartsWith::toString_abi_cxx11_
          (string *__return_storage_ptr__,StartsWith *this)

{
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  StartsWith *local_18;
  StartsWith *this_local;
  
  local_18 = this;
  this_local = (StartsWith *)__return_storage_ptr__;
  std::operator+(&local_58,"starts with: \"",&(this->m_data).m_str);
  std::operator+(&local_38,&local_58,"\"");
  CasedString::toStringSuffix_abi_cxx11_(&local_88,&this->m_data);
  std::operator+(__return_storage_ptr__,&local_38,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string toString() const {
                return "starts with: \"" + m_data.m_str + "\"" + m_data.toStringSuffix();
            }